

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O0

char * zt_cstr_dirname(char *npath,size_t len,char *path)

{
  size_t sVar1;
  ssize_t sVar2;
  char *in_RDX;
  size_t in_RSI;
  char *in_RDI;
  ssize_t unaff_retaddr;
  ssize_t ps_len;
  ssize_t end;
  char *str;
  char *in_stack_fffffffffffffff8;
  
  memset(in_RDI,0,in_RSI);
  str = in_RDX;
  sVar1 = strlen(in_RDX);
  strcmp(in_RDX + (sVar1 - 1),"/");
  sVar2 = zt_cstr_rfind(in_stack_fffffffffffffff8,(ssize_t)in_RDI,in_RSI,str);
  if (sVar2 == -1) {
    zt_cstr_copy((char *)end,ps_len,unaff_retaddr,in_stack_fffffffffffffff8,(size_t)in_RDI);
  }
  else {
    zt_cstr_copy((char *)end,ps_len,unaff_retaddr,in_stack_fffffffffffffff8,(size_t)in_RDI);
  }
  return in_RDI;
}

Assistant:

char *
zt_cstr_dirname(char *npath, size_t len, const char *path) {
    ssize_t    end    = -1;
    ssize_t    ps_len = 0;

    zt_assert(npath);
    zt_assert(path);

    memset(npath, '\0', len);

    /* if the end of the path is the PATH_SEPERATOR then skip over it */
    ps_len = strlen(PATH_SEPERATOR);
    if (strcmp(&path[strlen(path) - ps_len], PATH_SEPERATOR) == 0) {
        end = end - ps_len;
    }

    if ((end = zt_cstr_rfind(path, 0, end, PATH_SEPERATOR)) == -1) {
        /* there is no path seperator */
        zt_cstr_copy(".", 0, -1, npath, len);
        return npath;
    } else {
        end = end - 1;
    }

    zt_cstr_copy(path, 0, end, npath, len);
    return npath;
}